

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_scientific.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ScientificHandler::processQuantity
          (ScientificHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  undefined8 local_50;
  FractionSignificantSettings FStack_48;
  undefined8 local_40;
  undefined5 uStack_38;
  undefined3 uStack_33;
  undefined5 uStack_30;
  
  (*this->fParent->_vptr_MicroPropsGenerator[2])();
  if (U_ZERO_ERROR < *status) {
    return;
  }
  bVar1 = DecimalQuantity::isZero(quantity);
  if (!bVar1) {
    iVar2 = RoundingImpl::chooseMultiplierAndApply
                      (&micros->rounder,quantity,&this->super_MultiplierProducer,status);
    iVar3 = -iVar2;
    goto LAB_00262308;
  }
  if (this->fSettings->fRequireMinInt == true) {
    bVar1 = RoundingImpl::isSignificantDigits(&micros->rounder);
    if (!bVar1) goto LAB_002622f7;
    RoundingImpl::apply(&micros->rounder,quantity,(int)this->fSettings->fEngineeringInterval,*status
                       );
  }
  else {
LAB_002622f7:
    RoundingImpl::apply(&micros->rounder,quantity,status);
  }
  iVar3 = 0;
LAB_00262308:
  (micros->helpers).scientificModifier.fExponent = iVar3;
  (micros->helpers).scientificModifier.fHandler = this;
  micros->modInner = (Modifier *)&micros->helpers;
  RoundingImpl::passThrough();
  *(ulong *)&(micros->rounder).fPrecision.field_0x1d = CONCAT53(uStack_30,uStack_33);
  *(undefined8 *)((long)&(micros->rounder).fPrecision.fUnion + 8) = local_40;
  *(ulong *)&(micros->rounder).fPrecision.fRoundingMode = CONCAT35(uStack_33,uStack_38);
  *(undefined8 *)&(micros->rounder).fPrecision = local_50;
  (micros->rounder).fPrecision.fUnion.fracSig = FStack_48;
  return;
}

Assistant:

void ScientificHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                        UErrorCode &status) const {
    fParent->processQuantity(quantity, micros, status);
    if (U_FAILURE(status)) { return; }

    // Treat zero as if it had magnitude 0
    int32_t exponent;
    if (quantity.isZero()) {
        if (fSettings.fRequireMinInt && micros.rounder.isSignificantDigits()) {
            // Show "00.000E0" on pattern "00.000E0"
            micros.rounder.apply(quantity, fSettings.fEngineeringInterval, status);
            exponent = 0;
        } else {
            micros.rounder.apply(quantity, status);
            exponent = 0;
        }
    } else {
        exponent = -micros.rounder.chooseMultiplierAndApply(quantity, *this, status);
    }

    // Use MicroProps's helper ScientificModifier and save it as the modInner.
    ScientificModifier &mod = micros.helpers.scientificModifier;
    mod.set(exponent, this);
    micros.modInner = &mod;

    // We already performed rounding. Do not perform it again.
    micros.rounder = RoundingImpl::passThrough();
}